

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

int __thiscall chrono::ChArchiveIn::VersionRead(ChArchiveIn *this)

{
  int iVar1;
  int mver;
  int local_24;
  char *local_20;
  int *local_18;
  undefined1 local_10;
  
  iVar1 = 99999;
  if (this[0x48] == (ChArchiveIn)0x1) {
    local_18 = &local_24;
    local_20 = "_version";
    local_10 = 0;
    (**(code **)(*(long *)this + 0x18))();
    iVar1 = local_24;
  }
  return iVar1;
}

Assistant:

int VersionRead() {
          if (use_versions) {
              int mver;
              this->in(ChNameValue<int>("_version",mver));
              return mver;
          }
          return 99999;
      }